

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_pext_x86_64(target_ulong src,target_ulong mask)

{
  byte bVar1;
  int iVar2;
  int o;
  int i;
  target_ulong dest;
  target_ulong mask_local;
  target_ulong src_local;
  
  _o = 0;
  bVar1 = 0;
  for (dest = mask; dest != 0; dest = dest - 1 & dest) {
    iVar2 = ctz64(dest);
    _o = (src >> ((byte)iVar2 & 0x3f) & 1) << (bVar1 & 0x3f) | _o;
    bVar1 = bVar1 + 1;
  }
  return _o;
}

Assistant:

target_ulong helper_pext(target_ulong src, target_ulong mask)
{
    target_ulong dest = 0;
    int i, o;

    for (o = 0; mask != 0; o++) {
        i = ctztl(mask);
        mask &= mask - 1;
        dest |= ((src >> i) & 1) << o;
    }
    return dest;
}